

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::bindReplCount
          (Compilation *comp,ExpressionSyntax *syntax,ASTContext *context,size_t *count)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int *piVar3;
  _Optional_payload_base<int> local_48;
  optional<int> c;
  Expression *expr;
  size_t *count_local;
  ASTContext *context_local;
  ExpressionSyntax *syntax_local;
  Compilation *comp_local;
  
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&c,None);
  iVar2 = Expression::bind((int)syntax,(sockaddr *)context,
                           c.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>._M_payload._M_value);
  comp_local = (Compilation *)CONCAT44(extraout_var,iVar2);
  local_48 = (_Optional_payload_base<int>)ASTContext::evalInteger(context,(Expression *)comp_local);
  bVar1 = ASTContext::requireGtZero
                    (context,(optional<int>)local_48,
                     *(SourceRange *)&(comp_local->options).maxConstexprBacktrace);
  if (bVar1) {
    piVar3 = std::optional<int>::operator*((optional<int> *)&local_48);
    *count = (long)*piVar3;
  }
  else {
    comp_local = (Compilation *)Expression::badExpr(comp,(Expression *)comp_local);
  }
  return (Expression *)comp_local;
}

Assistant:

const Expression& ReplicatedAssignmentPatternExpression::bindReplCount(
    Compilation& comp, const ExpressionSyntax& syntax, const ASTContext& context, size_t& count) {

    const Expression& expr = bind(syntax, context);
    std::optional<int32_t> c = context.evalInteger(expr);
    if (!context.requireGtZero(c, expr.sourceRange))
        return badExpr(comp, &expr);

    count = size_t(*c);
    return expr;
}